

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O0

upb_ExtensionRegistryStatus
upb_ExtensionRegistry_AddArray(upb_ExtensionRegistry *r,upb_MiniTableExtension **e,size_t count)

{
  upb_MiniTable *l;
  size_t sVar1;
  upb_MiniTableExtension **ppuVar2;
  upb_ExtensionRegistryStatus uVar3;
  uint32_t fieldnum;
  upb_MiniTableExtension **local_60;
  char local_54 [8];
  char buf [12];
  upb_MiniTableExtension *ext;
  upb_ExtensionRegistryStatus status;
  upb_MiniTableExtension **end;
  upb_MiniTableExtension **start;
  size_t count_local;
  upb_MiniTableExtension **e_local;
  upb_ExtensionRegistry *r_local;
  
  count_local = (size_t)e;
  local_60 = e;
  if (count != 0) {
    local_60 = e + count;
  }
  while( true ) {
    sVar1 = count_local;
    if (local_60 <= count_local) {
      return kUpb_ExtensionRegistryStatus_Ok;
    }
    uVar3 = upb_ExtensionRegistry_Add(r,*(upb_MiniTableExtension **)count_local);
    ppuVar2 = e;
    if (uVar3 != kUpb_ExtensionRegistryStatus_Ok) break;
    count_local = count_local + 8;
  }
  while (count_local = (size_t)ppuVar2, count_local < sVar1) {
    buf._4_8_ = *(undefined8 *)count_local;
    l = ((upb_MiniTableExtension *)buf._4_8_)->extendee_dont_copy_me__upb_internal_use_only;
    fieldnum = upb_MiniTableExtension_Number((upb_MiniTableExtension *)buf._4_8_);
    extreg_key(local_54,l,fieldnum);
    upb_strtable_remove2(&r->exts,local_54,0xc,(upb_value *)0x0);
    ppuVar2 = (upb_MiniTableExtension **)(count_local + 8);
  }
  if (uVar3 != kUpb_ExtensionRegistryStatus_Ok) {
    return uVar3;
  }
  __assert_fail("status != kUpb_ExtensionRegistryStatus_Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/extension_registry.c"
                ,0x4f,
                "upb_ExtensionRegistryStatus upb_ExtensionRegistry_AddArray(upb_ExtensionRegistry *, const upb_MiniTableExtension **, size_t)"
               );
}

Assistant:

upb_ExtensionRegistryStatus upb_ExtensionRegistry_AddArray(
    upb_ExtensionRegistry* r, const upb_MiniTableExtension** e, size_t count) {
  const upb_MiniTableExtension** start = e;
  const upb_MiniTableExtension** end = UPB_PTRADD(e, count);
  upb_ExtensionRegistryStatus status = kUpb_ExtensionRegistryStatus_Ok;
  for (; e < end; e++) {
    status = upb_ExtensionRegistry_Add(r, *e);
    if (status != kUpb_ExtensionRegistryStatus_Ok) goto failure;
  }
  return kUpb_ExtensionRegistryStatus_Ok;

failure:
  // Back out the entries previously added.
  for (end = e, e = start; e < end; e++) {
    const upb_MiniTableExtension* ext = *e;
    char buf[EXTREG_KEY_SIZE];
    extreg_key(buf, ext->UPB_PRIVATE(extendee),
               upb_MiniTableExtension_Number(ext));
    upb_strtable_remove2(&r->exts, buf, EXTREG_KEY_SIZE, NULL);
  }
  UPB_ASSERT(status != kUpb_ExtensionRegistryStatus_Ok);
  return status;
}